

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

BIGNUM * BN_bin2bn(uchar *s,int len,BIGNUM *ret)

{
  BIGNUM *a;
  BIGNUM *pBVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint words;
  int iVar6;
  ulong uVar5;
  
  iVar6 = len;
  if (ret == (BIGNUM *)0x0) {
    a = BN_new();
    ret = a;
    if (a == (BIGNUM *)0x0) {
      return (BIGNUM *)0x0;
    }
  }
  else {
    a = (BIGNUM *)0x0;
  }
  for (; 0 < iVar6; iVar6 = iVar6 + -1) {
    if (*s != '\0') goto LAB_00111bea;
    s = s + 1;
  }
  iVar6 = len;
  if (-1 < len) {
    ((BIGNUM *)ret)->top = 0;
    return ret;
  }
LAB_00111bea:
  words = (iVar6 - 1U >> 3) + 1;
  uVar5 = (ulong)words;
  pBVar1 = bn_wexpand((BIGNUM *)ret,words);
  if (pBVar1 == (BIGNUM *)0x0) {
    BN_free(a);
    return (BIGNUM *)0x0;
  }
  uVar3 = iVar6 - 1U & 7;
  ((BIGNUM *)ret)->top = words;
  ((BIGNUM *)ret)->neg = 0;
  do {
    lVar2 = 0;
    uVar4 = 0;
    do {
      if (iVar6 == (int)lVar2) {
        bn_correct_top((BIGNUM *)ret);
        return ret;
      }
      uVar4 = (ulong)s[lVar2] | uVar4 << 8;
      lVar2 = lVar2 + 1;
    } while (uVar3 + 1 != (int)lVar2);
    uVar5 = (ulong)((int)uVar5 - 1);
    ((BIGNUM *)ret)->d[uVar5] = uVar4;
    s = s + lVar2;
    iVar6 = iVar6 - (int)lVar2;
    uVar3 = 7;
  } while( true );
}

Assistant:

BIGNUM *BN_bin2bn(const unsigned char *s, int len, BIGNUM *ret)
{
    unsigned int i, m;
    unsigned int n;
    BN_ULONG l;
    BIGNUM *bn = NULL;

    if (ret == NULL)
        ret = bn = BN_new();
    if (ret == NULL)
        return (NULL);
    bn_check_top(ret);
    /* Skip leading zero's. */
    for ( ; len > 0 && *s == 0; s++, len--)
        continue;
    n = len;
    if (n == 0) {
        ret->top = 0;
        return (ret);
    }
    i = ((n - 1) / BN_BYTES) + 1;
    m = ((n - 1) % (BN_BYTES));
    if (bn_wexpand(ret, (int)i) == NULL) {
        BN_free(bn);
        return NULL;
    }
    ret->top = i;
    ret->neg = 0;
    l = 0;
    while (n--) {
        l = (l << 8L) | *(s++);
        if (m-- == 0) {
            ret->d[--i] = l;
            l = 0;
            m = BN_BYTES - 1;
        }
    }
    /*
     * need to call this due to clear byte at top if avoiding having the top
     * bit set (-ve number)
     */
    bn_correct_top(ret);
    return (ret);
}